

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Count.cpp
# Opt level: O1

void __thiscall Count::~Count(Count *this)

{
  ~Count(this);
  operator_delete(this);
  return;
}

Assistant:

Count::~Count()
{
}